

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

AActor * P_SpawnSubMissile(AActor *source,PClassActor *type,AActor *target)

{
  double dVar1;
  double dVar2;
  BYTE BVar3;
  bool bVar4;
  AActor *this;
  DAngle pitch;
  undefined8 local_48;
  undefined1 local_40 [8];
  DAngle local_38;
  DAngle local_30;
  DObject *local_28;
  
  local_38.Degrees = (source->__Pos).X;
  local_30.Degrees = (source->__Pos).Y;
  local_28 = (DObject *)(source->__Pos).Z;
  this = AActor::StaticSpawn(type,(DVector3 *)&stack0xffffffffffffffc8,ALLOW_REPLACE,false);
  if (type != (PClassActor *)0x0) {
    (this->target).field_0.p = target;
    (this->Angles).Yaw.Degrees = (source->Angles).Yaw.Degrees;
    AActor::VelFromAngle(this);
    if (((this->flags4).Value & 0x40000) != 0) {
      if ((((source->flags).Value & 0x10000) == 0) || (((source->flags4).Value & 0x40000) == 0)) {
        if (target->player == (player_t *)0x0) {
          BVar3 = '\0';
        }
        else {
          BVar3 = (char)((int)target->player + 0xfe81a1b0U >> 5) * '=' + '\x01';
        }
      }
      else {
        BVar3 = source->FriendPlayer;
      }
      this->FriendPlayer = BVar3;
    }
    bVar4 = P_CheckMissileSpawn(this,source->radius);
    if (bVar4) {
      local_40 = (undefined1  [8])(source->Angles).Yaw.Degrees;
      local_48 = 0;
      P_AimLineAttack((AActor *)&stack0xffffffffffffffc8,(DAngle *)source,1024.0,
                      (FTranslatedLineTarget *)local_40,(DAngle *)0x0,(int)&local_48,(AActor *)0x0,
                      (AActor *)0x0);
      dVar1 = this->Speed;
      dVar2 = FFastTrig::sin(&fasttrig,local_38.Degrees * 11930464.711111112 + 6755399441055744.0);
      (this->Vel).Z = dVar2 * -dVar1;
      return this;
    }
  }
  return (AActor *)0x0;
}

Assistant:

AActor *P_SpawnSubMissile(AActor *source, PClassActor *type, AActor *target)
{
	AActor *other = Spawn(type, source->Pos(), ALLOW_REPLACE);

	if (source == nullptr || type == nullptr)
	{
		return nullptr;
	}

	other->target = target;
	other->Angles.Yaw = source->Angles.Yaw;
	other->VelFromAngle();

	if (other->flags4 & MF4_SPECTRAL)
	{
		if (source->flags & MF_MISSILE && source->flags4 & MF4_SPECTRAL)
		{
			other->FriendPlayer = source->FriendPlayer;
		}
		else
		{
			other->SetFriendPlayer(target->player);
		}
	}

	if (P_CheckMissileSpawn(other, source->radius))
	{
		DAngle pitch = P_AimLineAttack(source, source->Angles.Yaw, 1024.);
		other->Vel.Z = -other->Speed * pitch.Sin();
		return other;
	}
	return NULL;
}